

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
::occluded(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
           *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  CollideFunc p_Var6;
  char *pcVar7;
  IntersectFunc p_Var8;
  OccludedFunc p_Var9;
  PointQueryFunc p_Var10;
  char *pcVar11;
  char *pcVar12;
  IntersectFunc4 p_Var13;
  OccludedFunc4 p_Var14;
  char *pcVar15;
  IntersectFunc4 p_Var16;
  OccludedFunc4 p_Var17;
  char *pcVar18;
  IntersectFunc8 p_Var19;
  undefined8 uVar20;
  undefined8 uVar21;
  uint uVar22;
  uint uVar23;
  undefined4 uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  Intersectors *pIVar28;
  long lVar29;
  BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
  *pBVar30;
  BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
  *pBVar31;
  NodeRef root;
  size_t sVar32;
  int iVar33;
  size_t sVar34;
  ulong uVar35;
  uint uVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  NodeRef *pNVar38;
  bool bVar39;
  float fVar49;
  vint4 bi_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint uVar50;
  float fVar51;
  uint uVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar56;
  float fVar61;
  float fVar64;
  float fVar65;
  vint4 bi;
  float fVar66;
  undefined1 auVar62 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar63;
  float fVar67;
  float fVar70;
  float fVar71;
  vint4 ai;
  undefined1 auVar68 [16];
  float fVar72;
  undefined1 auVar69 [16];
  float fVar73;
  float fVar75;
  float fVar76;
  vint4 ai_1;
  undefined1 auVar74 [16];
  float fVar77;
  float fVar78;
  float fVar81;
  float fVar82;
  vint4 ai_3;
  undefined1 auVar79 [16];
  float fVar83;
  undefined1 auVar80 [16];
  uint uVar88;
  vint4 bi_2;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar89;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  vint4 bi_3;
  uint uVar93;
  uint uVar96;
  uint uVar97;
  vint4 ai_2;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar98;
  uint uVar99;
  uint uVar100;
  uint uVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  uint uVar105;
  uint uVar106;
  uint uVar107;
  uint uVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  Precalculations pre;
  uint local_18f8;
  uint uStack_18f4;
  uint uStack_18f0;
  uint uStack_18ec;
  vbool<4> terminated;
  float local_1888;
  float fStack_1884;
  float fStack_1880;
  float fStack_187c;
  TravRayK<4,_false> tray;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar52 [16];
  
  uVar21 = mm_lookupmask_ps._8_8_;
  uVar20 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)(valid_i->field_0).v[0];
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    pIVar28 = This;
    if ((*(long *)(ray + 8) != 0) &&
       (pIVar28 = *(Intersectors **)(ray + 0x10), ((ulong)pIVar28->ptr & 0x10000) != 0)) {
      occludedCoherent(this,valid_i,This,ray,context);
      return;
    }
    auVar68 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
    auVar74._0_12_ = ZEXT812(0);
    auVar74._12_4_ = 0;
    uVar50 = -(uint)(*(int *)this == -1 && 0.0 <= auVar68._0_4_);
    uVar57 = -(uint)(*(int *)(this + 4) == -1 && 0.0 <= auVar68._4_4_);
    auVar52._0_8_ = CONCAT44(uVar57,uVar50);
    auVar52._8_4_ = -(uint)(*(int *)(this + 8) == -1 && 0.0 <= auVar68._8_4_);
    auVar52._12_4_ = -(uint)(*(int *)(this + 0xc) == -1 && 0.0 <= auVar68._12_4_);
    iVar27 = movmskps((int)pIVar28,auVar52);
    if (iVar27 != 0) {
      tray.org.field_0._0_8_ = This->ptr;
      tray.org.field_0._8_8_ = This->leafIntersector;
      tray.org.field_0._16_8_ = (This->collider).collide;
      tray.org.field_0._24_8_ = (This->collider).name;
      tray.org.field_0._32_8_ = (This->intersector1).intersect;
      tray.org.field_0._40_8_ = (This->intersector1).occluded;
      tray.dir.field_0._0_8_ = (This->intersector4).intersect;
      tray.dir.field_0._8_8_ = (This->intersector4).occluded;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)*(undefined1 (*) [16])&(This->intersector4).name;
      tray.dir.field_0._32_8_ = (This->intersector4_filter).occluded;
      tray.dir.field_0._40_8_ = (This->intersector4_filter).name;
      fVar51 = (float)DAT_01f80d30;
      fVar58 = DAT_01f80d30._4_4_;
      fVar59 = DAT_01f80d30._8_4_;
      fVar60 = DAT_01f80d30._12_4_;
      auVar79._4_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._0_8_ >> 0x20)) < fVar58);
      auVar79._0_4_ = -(uint)(ABS((float)tray.dir.field_0._0_8_) < fVar51);
      auVar79._8_4_ = -(uint)(ABS((float)tray.dir.field_0._8_8_) < fVar59);
      auVar79._12_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._8_8_ >> 0x20)) < fVar60);
      auVar94 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f80d30,auVar79)
      ;
      auVar84._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar58);
      auVar84._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar51);
      auVar84._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar59);
      auVar84._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar60);
      auVar84 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f80d30,auVar84)
      ;
      auVar40._4_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._32_8_ >> 0x20)) < fVar58);
      auVar40._0_4_ = -(uint)(ABS((float)tray.dir.field_0._32_8_) < fVar51);
      auVar40._8_4_ = -(uint)(ABS((float)tray.dir.field_0._40_8_) < fVar59);
      auVar40._12_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._40_8_ >> 0x20)) < fVar60);
      auVar79 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f80d30,auVar40)
      ;
      auVar41 = rcpps(auVar40,auVar94);
      fVar51 = auVar41._0_4_;
      auVar95._0_4_ = auVar94._0_4_ * fVar51;
      fVar58 = auVar41._4_4_;
      auVar95._4_4_ = auVar94._4_4_ * fVar58;
      fVar59 = auVar41._8_4_;
      auVar95._8_4_ = auVar94._8_4_ * fVar59;
      fVar60 = auVar41._12_4_;
      auVar95._12_4_ = auVar94._12_4_ * fVar60;
      tray.rdir.field_0._0_4_ = (1.0 - auVar95._0_4_) * fVar51 + fVar51;
      tray.rdir.field_0._4_4_ = (1.0 - auVar95._4_4_) * fVar58 + fVar58;
      tray.rdir.field_0._8_4_ = (1.0 - auVar95._8_4_) * fVar59 + fVar59;
      tray.rdir.field_0._12_4_ = (1.0 - auVar95._12_4_) * fVar60 + fVar60;
      auVar41 = rcpps(auVar95,auVar84);
      fVar51 = auVar41._0_4_;
      auVar85._0_4_ = auVar84._0_4_ * fVar51;
      fVar58 = auVar41._4_4_;
      auVar85._4_4_ = auVar84._4_4_ * fVar58;
      fVar59 = auVar41._8_4_;
      auVar85._8_4_ = auVar84._8_4_ * fVar59;
      fVar60 = auVar41._12_4_;
      auVar85._12_4_ = auVar84._12_4_ * fVar60;
      tray.rdir.field_0._16_4_ = (1.0 - auVar85._0_4_) * fVar51 + fVar51;
      tray.rdir.field_0._20_4_ = (1.0 - auVar85._4_4_) * fVar58 + fVar58;
      tray.rdir.field_0._24_4_ = (1.0 - auVar85._8_4_) * fVar59 + fVar59;
      tray.rdir.field_0._28_4_ = (1.0 - auVar85._12_4_) * fVar60 + fVar60;
      auVar41 = rcpps(auVar85,auVar79);
      fVar51 = auVar41._0_4_;
      fVar58 = auVar41._4_4_;
      fVar59 = auVar41._8_4_;
      fVar60 = auVar41._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar79._0_4_ * fVar51) * fVar51 + fVar51;
      tray.rdir.field_0._36_4_ = (1.0 - auVar79._4_4_ * fVar58) * fVar58 + fVar58;
      tray.rdir.field_0._40_4_ = (1.0 - auVar79._8_4_ * fVar59) * fVar59 + fVar59;
      tray.rdir.field_0._44_4_ = (1.0 - auVar79._12_4_ * fVar60) * fVar60 + fVar60;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar94._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar94._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar94._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar94._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar94);
      auVar42._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar42._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar42._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar42._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar42);
      auVar41._0_8_ = (This->intersector1).pointQuery;
      auVar41._8_8_ = (This->intersector1).name;
      auVar41 = maxps(auVar41,auVar74);
      auVar68 = maxps(auVar68,auVar74);
      iVar27 = (int)DAT_01f7a9f0;
      iVar102 = DAT_01f7a9f0._4_4_;
      iVar103 = DAT_01f7a9f0._8_4_;
      iVar104 = DAT_01f7a9f0._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar41,auVar52);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar68,auVar52);
      terminated.field_0._0_8_ = auVar52._0_8_ ^ 0xffffffffffffffff;
      terminated.field_0.i[2] = auVar52._8_4_ ^ 0xffffffff;
      terminated.field_0.i[3] = auVar52._12_4_ ^ 0xffffffff;
      if (*(long *)(ray + 8) == 0) {
        uVar36 = 3;
      }
      else {
        uVar36 = ((*(byte *)(*(long *)(ray + 0x10) + 2) & 1) == 0) + 2;
      }
      pNVar38 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar37 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar22 = 0x21d2f80;
LAB_002310b4:
      do {
        do {
          root.ptr = pNVar38[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_002317e4;
          pNVar38 = pNVar38 + -1;
          paVar37 = paVar37 + -1;
          aVar53.v = *(__m128 *)paVar37->v;
          auVar68._4_4_ = -(uint)(aVar53.v[1] < tray.tfar.field_0.v[1]);
          auVar68._0_4_ = -(uint)(aVar53.v[0] < tray.tfar.field_0.v[0]);
          auVar68._8_4_ = -(uint)(aVar53.v[2] < tray.tfar.field_0.v[2]);
          auVar68._12_4_ = -(uint)(aVar53._12_4_ < tray.tfar.field_0.v[3]);
          uVar22 = movmskps(uVar22,auVar68);
        } while (uVar22 == 0);
        uVar25 = (ulong)(byte)uVar22;
        uVar23 = POPCOUNT(uVar22 & 0xff);
        uVar22 = uVar23;
        if (uVar36 < uVar23) {
LAB_002310f2:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_002317e4;
              auVar45._4_4_ = -(uint)(aVar53.v[1] < tray.tfar.field_0.v[1]);
              auVar45._0_4_ = -(uint)(aVar53.v[0] < tray.tfar.field_0.v[0]);
              auVar45._8_4_ = -(uint)(aVar53.v[2] < tray.tfar.field_0.v[2]);
              auVar45._12_4_ = -(uint)(aVar53.v[3] < tray.tfar.field_0.v[3]);
              uVar22 = movmskps(uVar22,auVar45);
              if (uVar22 == 0) goto LAB_002310b4;
              uVar25 = (ulong)((uint)root.ptr & 0xf) - 8;
              aVar56 = terminated.field_0;
              if (uVar25 == 0) goto LAB_002316cf;
              auVar54._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar54._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar54._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              p_Var6 = (This->collider).collide;
              pcVar7 = (This->collider).name;
              p_Var8 = (This->intersector1).intersect;
              p_Var9 = (This->intersector1).occluded;
              p_Var10 = (This->intersector1).pointQuery;
              pcVar11 = (This->intersector1).name;
              pcVar12 = (This->intersector4).name;
              p_Var13 = (This->intersector4_filter).intersect;
              p_Var14 = (This->intersector4_filter).occluded;
              pcVar15 = (This->intersector4_filter).name;
              p_Var16 = (This->intersector4).intersect;
              p_Var17 = (This->intersector4).occluded;
              pcVar18 = (This->intersector4_nofilter).name;
              p_Var19 = (This->intersector8).intersect;
              lVar29 = (root.ptr & 0xfffffffffffffff0) + 0x90;
              uVar26 = 0;
              goto LAB_00231375;
            }
            lVar29 = 0;
            aVar53.i[1] = iVar102;
            aVar53.i[0] = iVar27;
            aVar53.i[2] = iVar103;
            aVar53.i[3] = iVar104;
            sVar34 = 8;
            do {
              sVar1 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar29 * 8);
              sVar32 = sVar34;
              if (sVar1 == 8) break;
              fVar51 = *(float *)(root.ptr + 0x20 + lVar29 * 4);
              fVar58 = *(float *)(root.ptr + 0x30 + lVar29 * 4);
              fVar59 = *(float *)(root.ptr + 0x40 + lVar29 * 4);
              fVar60 = *(float *)(root.ptr + 0x50 + lVar29 * 4);
              fVar67 = (fVar51 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar70 = (fVar51 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar71 = (fVar51 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar72 = (fVar51 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar73 = (fVar59 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar75 = (fVar59 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar76 = (fVar59 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar77 = (fVar59 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar51 = *(float *)(root.ptr + 0x60 + lVar29 * 4);
              fVar78 = (fVar51 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar81 = (fVar51 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar82 = (fVar51 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar83 = (fVar51 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              fVar61 = (fVar58 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar64 = (fVar58 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar65 = (fVar58 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar66 = (fVar58 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar58 = (fVar60 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar59 = (fVar60 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar49 = (fVar60 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar60 = (fVar60 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar51 = *(float *)(root.ptr + 0x70 + lVar29 * 4);
              fVar90 = (fVar51 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar91 = (fVar51 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar92 = (fVar51 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar51 = (fVar51 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              uVar22 = (uint)((int)fVar61 < (int)fVar67) * (int)fVar61 |
                       (uint)((int)fVar61 >= (int)fVar67) * (int)fVar67;
              uVar23 = (uint)((int)fVar64 < (int)fVar70) * (int)fVar64 |
                       (uint)((int)fVar64 >= (int)fVar70) * (int)fVar70;
              uVar88 = (uint)((int)fVar65 < (int)fVar71) * (int)fVar65 |
                       (uint)((int)fVar65 >= (int)fVar71) * (int)fVar71;
              uVar89 = (uint)((int)fVar66 < (int)fVar72) * (int)fVar66 |
                       (uint)((int)fVar66 >= (int)fVar72) * (int)fVar72;
              uVar93 = (uint)((int)fVar58 < (int)fVar73) * (int)fVar58 |
                       (uint)((int)fVar58 >= (int)fVar73) * (int)fVar73;
              uVar96 = (uint)((int)fVar59 < (int)fVar75) * (int)fVar59 |
                       (uint)((int)fVar59 >= (int)fVar75) * (int)fVar75;
              uVar97 = (uint)((int)fVar49 < (int)fVar76) * (int)fVar49 |
                       (uint)((int)fVar49 >= (int)fVar76) * (int)fVar76;
              uVar98 = (uint)((int)fVar60 < (int)fVar77) * (int)fVar60 |
                       (uint)((int)fVar60 >= (int)fVar77) * (int)fVar77;
              uVar93 = ((int)uVar93 < (int)uVar22) * uVar22 | ((int)uVar93 >= (int)uVar22) * uVar93;
              uVar96 = ((int)uVar96 < (int)uVar23) * uVar23 | ((int)uVar96 >= (int)uVar23) * uVar96;
              uVar97 = ((int)uVar97 < (int)uVar88) * uVar88 | ((int)uVar97 >= (int)uVar88) * uVar97;
              uVar98 = ((int)uVar98 < (int)uVar89) * uVar89 | ((int)uVar98 >= (int)uVar89) * uVar98;
              uVar22 = (uint)((int)fVar90 < (int)fVar78) * (int)fVar90 |
                       (uint)((int)fVar90 >= (int)fVar78) * (int)fVar78;
              uVar23 = (uint)((int)fVar91 < (int)fVar81) * (int)fVar91 |
                       (uint)((int)fVar91 >= (int)fVar81) * (int)fVar81;
              uVar88 = (uint)((int)fVar92 < (int)fVar82) * (int)fVar92 |
                       (uint)((int)fVar92 >= (int)fVar82) * (int)fVar82;
              uVar89 = (uint)((int)fVar51 < (int)fVar83) * (int)fVar51 |
                       (uint)((int)fVar51 >= (int)fVar83) * (int)fVar83;
              auVar86._0_4_ =
                   ((int)uVar22 < (int)uVar93) * uVar93 | ((int)uVar22 >= (int)uVar93) * uVar22;
              auVar86._4_4_ =
                   ((int)uVar23 < (int)uVar96) * uVar96 | ((int)uVar23 >= (int)uVar96) * uVar23;
              auVar86._8_4_ =
                   ((int)uVar88 < (int)uVar97) * uVar97 | ((int)uVar88 >= (int)uVar97) * uVar88;
              auVar86._12_4_ =
                   ((int)uVar89 < (int)uVar98) * uVar98 | ((int)uVar89 >= (int)uVar98) * uVar89;
              uVar93 = (uint)((int)fVar61 < (int)fVar67) * (int)fVar67 |
                       (uint)((int)fVar61 >= (int)fVar67) * (int)fVar61;
              uVar96 = (uint)((int)fVar64 < (int)fVar70) * (int)fVar70 |
                       (uint)((int)fVar64 >= (int)fVar70) * (int)fVar64;
              uVar97 = (uint)((int)fVar65 < (int)fVar71) * (int)fVar71 |
                       (uint)((int)fVar65 >= (int)fVar71) * (int)fVar65;
              uVar98 = (uint)((int)fVar66 < (int)fVar72) * (int)fVar72 |
                       (uint)((int)fVar66 >= (int)fVar72) * (int)fVar66;
              uVar22 = (uint)((int)fVar58 < (int)fVar73) * (int)fVar73 |
                       (uint)((int)fVar58 >= (int)fVar73) * (int)fVar58;
              uVar23 = (uint)((int)fVar59 < (int)fVar75) * (int)fVar75 |
                       (uint)((int)fVar59 >= (int)fVar75) * (int)fVar59;
              uVar88 = (uint)((int)fVar49 < (int)fVar76) * (int)fVar76 |
                       (uint)((int)fVar49 >= (int)fVar76) * (int)fVar49;
              uVar89 = (uint)((int)fVar60 < (int)fVar77) * (int)fVar77 |
                       (uint)((int)fVar60 >= (int)fVar77) * (int)fVar60;
              uVar22 = ((int)uVar93 < (int)uVar22) * uVar93 | ((int)uVar93 >= (int)uVar22) * uVar22;
              uVar23 = ((int)uVar96 < (int)uVar23) * uVar96 | ((int)uVar96 >= (int)uVar23) * uVar23;
              uVar88 = ((int)uVar97 < (int)uVar88) * uVar97 | ((int)uVar97 >= (int)uVar88) * uVar88;
              uVar89 = ((int)uVar98 < (int)uVar89) * uVar98 | ((int)uVar98 >= (int)uVar89) * uVar89;
              uVar93 = (uint)((int)fVar90 < (int)fVar78) * (int)fVar78 |
                       (uint)((int)fVar90 >= (int)fVar78) * (int)fVar90;
              uVar96 = (uint)((int)fVar91 < (int)fVar81) * (int)fVar81 |
                       (uint)((int)fVar91 >= (int)fVar81) * (int)fVar91;
              uVar97 = (uint)((int)fVar92 < (int)fVar82) * (int)fVar82 |
                       (uint)((int)fVar92 >= (int)fVar82) * (int)fVar92;
              uVar98 = (uint)((int)fVar51 < (int)fVar83) * (int)fVar83 |
                       (uint)((int)fVar51 >= (int)fVar83) * (int)fVar51;
              uVar22 = ((int)uVar22 < (int)uVar93) * uVar22 | ((int)uVar22 >= (int)uVar93) * uVar93;
              uVar23 = ((int)uVar23 < (int)uVar96) * uVar23 | ((int)uVar23 >= (int)uVar96) * uVar96;
              uVar88 = ((int)uVar88 < (int)uVar97) * uVar88 | ((int)uVar88 >= (int)uVar97) * uVar97;
              uVar89 = ((int)uVar89 < (int)uVar98) * uVar89 | ((int)uVar89 >= (int)uVar98) * uVar98;
              auVar43._4_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar86._4_4_) * auVar86._4_4_ |
                                  (uint)(tray.tnear.field_0.i[1] >= (int)auVar86._4_4_) *
                                  tray.tnear.field_0.i[1]) <=
                          (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar23) *
                                  tray.tfar.field_0.i[1] |
                                 (tray.tfar.field_0.i[1] >= (int)uVar23) * uVar23));
              auVar43._0_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar86._0_4_) * auVar86._0_4_ |
                                  (uint)(tray.tnear.field_0.i[0] >= (int)auVar86._0_4_) *
                                  tray.tnear.field_0.i[0]) <=
                          (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar22) *
                                  tray.tfar.field_0.i[0] |
                                 (tray.tfar.field_0.i[0] >= (int)uVar22) * uVar22));
              auVar43._8_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar86._8_4_) * auVar86._8_4_ |
                                  (uint)(tray.tnear.field_0.i[2] >= (int)auVar86._8_4_) *
                                  tray.tnear.field_0.i[2]) <=
                          (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar88) *
                                  tray.tfar.field_0.i[2] |
                                 (tray.tfar.field_0.i[2] >= (int)uVar88) * uVar88));
              auVar43._12_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar86._12_4_) * auVar86._12_4_
                                  | (uint)(tray.tnear.field_0.i[3] >= (int)auVar86._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                          (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar89) *
                                  tray.tfar.field_0.i[3] |
                                 (tray.tfar.field_0.i[3] >= (int)uVar89) * uVar89));
              uVar22 = movmskps((int)this,auVar43);
              this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
                      *)(ulong)uVar22;
              aVar63 = aVar53;
              if ((uVar22 != 0) &&
                 (auVar62._4_4_ = iVar102, auVar62._0_4_ = iVar27, auVar62._8_4_ = iVar103,
                 auVar62._12_4_ = iVar104,
                 aVar63 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                          blendvps(auVar62,auVar86,auVar43), sVar32 = sVar1, sVar34 != 8)) {
                pNVar38->ptr = sVar34;
                pNVar38 = pNVar38 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar37->v = aVar53;
                paVar37 = paVar37 + 1;
              }
              aVar53 = aVar63;
              lVar29 = lVar29 + 1;
              sVar34 = sVar32;
            } while (lVar29 != 4);
            if (sVar32 == 8) goto LAB_0023128e;
            auVar44._4_4_ = -(uint)(aVar53.v[1] < tray.tfar.field_0.v[1]);
            auVar44._0_4_ = -(uint)(aVar53.v[0] < tray.tfar.field_0.v[0]);
            auVar44._8_4_ = -(uint)(aVar53.v[2] < tray.tfar.field_0.v[2]);
            auVar44._12_4_ = -(uint)(aVar53.v[3] < tray.tfar.field_0.v[3]);
            uVar24 = movmskps((uint)root.ptr,auVar44);
            uVar22 = POPCOUNT(uVar24);
            root.ptr = sVar32;
          } while ((byte)uVar36 < (byte)uVar22);
          pNVar38->ptr = sVar32;
          pNVar38 = pNVar38 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar37->v = aVar53;
          paVar37 = paVar37 + 1;
LAB_0023128e:
          uVar22 = 4;
        }
        else {
          do {
            sVar34 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> sVar34 & 1) == 0; sVar34 = sVar34 + 1) {
              }
            }
            this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
                    *)valid_i;
            bVar39 = occluded1((Intersectors *)valid_i,bvh,root,sVar34,&pre,(RayK<4> *)This,&tray,
                               (RayQueryContext *)ray);
            if (bVar39) {
              terminated.field_0.i[sVar34] = -1;
            }
            uVar25 = uVar25 & uVar25 - 1;
          } while (uVar25 != 0);
          iVar27 = movmskps(0,(undefined1  [16])terminated.field_0);
          uVar22 = 3;
          if (iVar27 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar22 = 2;
          }
          iVar27 = 0x7f800000;
          iVar102 = 0x7f800000;
          iVar103 = 0x7f800000;
          iVar104 = 0x7f800000;
          if (uVar36 < uVar23) goto LAB_002310f2;
        }
      } while (uVar22 != 3);
LAB_002317e4:
      auVar48._0_4_ = uVar50 & terminated.field_0.i[0];
      auVar48._4_4_ = uVar57 & terminated.field_0.i[1];
      auVar48._8_4_ = auVar52._8_4_ & terminated.field_0.i[2];
      auVar48._12_4_ = auVar52._12_4_ & terminated.field_0.i[3];
      auVar68 = blendvps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,_DAT_01f7aa00,
                         auVar48);
      *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar68;
    }
  }
  return;
  while( true ) {
    uVar26 = uVar26 + 1;
    lVar29 = lVar29 + 0xb0;
    auVar54 = auVar55;
    if (uVar25 <= uVar26) break;
LAB_00231375:
    pBVar30 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
               *)0x0;
    auVar80 = auVar54;
    while( true ) {
      uVar35 = (ulong)*(uint *)(lVar29 + (long)pBVar30 * 4);
      pBVar31 = pBVar30;
      this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
              *)0xffffffff;
      if (uVar35 == 0xffffffff) break;
      fVar51 = *(float *)(lVar29 + -0x90 + (long)pBVar30 * 4);
      fVar58 = *(float *)(lVar29 + -0x80 + (long)pBVar30 * 4);
      fVar59 = *(float *)(lVar29 + -0x70 + (long)pBVar30 * 4);
      local_1888 = SUB84(This->ptr,0);
      fStack_1884 = (float)((ulong)This->ptr >> 0x20);
      fStack_1880 = SUB84(This->leafIntersector,0);
      fStack_187c = (float)((ulong)This->leafIntersector >> 0x20);
      local_1888 = fVar51 - local_1888;
      fStack_1884 = fVar51 - fStack_1884;
      fStack_1880 = fVar51 - fStack_1880;
      fVar51 = fVar51 - fStack_187c;
      local_16e8 = SUB84(p_Var6,0);
      fStack_16e4 = (float)((ulong)p_Var6 >> 0x20);
      fStack_16e0 = SUB84(pcVar7,0);
      fStack_16dc = (float)((ulong)pcVar7 >> 0x20);
      local_16e8 = fVar58 - local_16e8;
      fStack_16e4 = fVar58 - fStack_16e4;
      fStack_16e0 = fVar58 - fStack_16e0;
      fVar58 = fVar58 - fStack_16dc;
      local_16f8 = SUB84(p_Var8,0);
      fStack_16f4 = (float)((ulong)p_Var8 >> 0x20);
      fStack_16f0 = SUB84(p_Var9,0);
      fStack_16ec = (float)((ulong)p_Var9 >> 0x20);
      local_16f8 = fVar59 - local_16f8;
      fStack_16f4 = fVar59 - fStack_16f4;
      fStack_16f0 = fVar59 - fStack_16f0;
      fVar59 = fVar59 - fStack_16ec;
      fVar60 = *(float *)(lVar29 + -0x60 + (long)pBVar30 * 4);
      fVar49 = *(float *)(lVar29 + -0x50 + (long)pBVar30 * 4);
      fVar61 = *(float *)(lVar29 + -0x40 + (long)pBVar30 * 4);
      fVar64 = *(float *)(lVar29 + -0x30 + (long)pBVar30 * 4);
      fVar65 = *(float *)(lVar29 + -0x20 + (long)pBVar30 * 4);
      fVar66 = *(float *)(lVar29 + -0x10 + (long)pBVar30 * 4);
      fVar72 = fVar61 * fVar65 - fVar49 * fVar66;
      fVar81 = fVar66 * fVar60 - fVar61 * fVar64;
      fVar73 = fVar64 * fVar49 - fVar65 * fVar60;
      local_1708 = SUB84(pcVar12,0);
      fStack_1704 = (float)((ulong)pcVar12 >> 0x20);
      fStack_1700 = SUB84(p_Var13,0);
      fStack_16fc = (float)((ulong)p_Var13 >> 0x20);
      local_1718 = SUB84(p_Var14,0);
      fStack_1714 = (float)((ulong)p_Var14 >> 0x20);
      fStack_1710 = SUB84(pcVar15,0);
      fStack_170c = (float)((ulong)pcVar15 >> 0x20);
      fVar92 = local_16e8 * local_1718 - local_16f8 * local_1708;
      fVar109 = fStack_16e4 * fStack_1714 - fStack_16f4 * fStack_1704;
      fVar110 = fStack_16e0 * fStack_1710 - fStack_16f0 * fStack_1700;
      fVar111 = fVar58 * fStack_170c - fVar59 * fStack_16fc;
      local_1728 = SUB84(p_Var16,0);
      fStack_1724 = (float)((ulong)p_Var16 >> 0x20);
      fStack_1720 = SUB84(p_Var17,0);
      fStack_171c = (float)((ulong)p_Var17 >> 0x20);
      fVar112 = local_16f8 * local_1728 - local_1888 * local_1718;
      fVar113 = fStack_16f4 * fStack_1724 - fStack_1884 * fStack_1714;
      fVar114 = fStack_16f0 * fStack_1720 - fStack_1880 * fStack_1710;
      fVar115 = fVar59 * fStack_171c - fVar51 * fStack_170c;
      fVar82 = local_1888 * local_1708 - local_16e8 * local_1728;
      fVar83 = fStack_1884 * fStack_1704 - fStack_16e4 * fStack_1724;
      fVar90 = fStack_1880 * fStack_1700 - fStack_16e0 * fStack_1720;
      fVar91 = fVar51 * fStack_16fc - fVar58 * fStack_171c;
      fVar75 = fVar72 * local_1728 + fVar81 * local_1708 + fVar73 * local_1718;
      fVar76 = fVar72 * fStack_1724 + fVar81 * fStack_1704 + fVar73 * fStack_1714;
      fVar77 = fVar72 * fStack_1720 + fVar81 * fStack_1700 + fVar73 * fStack_1710;
      fVar78 = fVar72 * fStack_171c + fVar81 * fStack_16fc + fVar73 * fStack_170c;
      uVar98 = (uint)fVar75 & 0x80000000;
      uVar99 = (uint)fVar76 & 0x80000000;
      uVar100 = (uint)fVar77 & 0x80000000;
      uVar101 = (uint)fVar78 & 0x80000000;
      fVar67 = (float)((uint)(fVar64 * fVar92 + fVar65 * fVar112 + fVar66 * fVar82) ^ uVar98);
      fVar70 = (float)((uint)(fVar64 * fVar109 + fVar65 * fVar113 + fVar66 * fVar83) ^ uVar99);
      fVar71 = (float)((uint)(fVar64 * fVar110 + fVar65 * fVar114 + fVar66 * fVar90) ^ uVar100);
      fVar64 = (float)((uint)(fVar64 * fVar111 + fVar65 * fVar115 + fVar66 * fVar91) ^ uVar101);
      uVar93 = auVar80._0_4_;
      uVar96 = auVar80._8_4_;
      uVar97 = auVar80._12_4_;
      auVar87._0_4_ = -(uint)(0.0 <= fVar67) & uVar93;
      auVar87._4_4_ = -(uint)(0.0 <= fVar70) & auVar80._4_4_;
      auVar87._8_4_ = -(uint)(0.0 <= fVar71) & uVar96;
      auVar87._12_4_ = -(uint)(0.0 <= fVar64) & uVar97;
      iVar27 = movmskps(0xffffffff,auVar87);
      local_18f8 = (uint)uVar20;
      uStack_18f4 = SUB84(uVar20,4);
      uStack_18f0 = (uint)uVar21;
      uStack_18ec = SUB84(uVar21,4);
      uVar22 = local_18f8;
      uVar23 = uStack_18f4;
      uVar88 = uStack_18f0;
      uVar89 = uStack_18ec;
      if (iVar27 != 0) {
        fVar65 = (float)((uint)(fVar60 * fVar92 + fVar49 * fVar112 + fVar61 * fVar82) ^ uVar98);
        fVar66 = (float)((uint)(fVar60 * fVar109 + fVar49 * fVar113 + fVar61 * fVar83) ^ uVar99);
        fVar82 = (float)((uint)(fVar60 * fVar110 + fVar49 * fVar114 + fVar61 * fVar90) ^ uVar100);
        fVar60 = (float)((uint)(fVar60 * fVar111 + fVar49 * fVar115 + fVar61 * fVar91) ^ uVar101);
        uVar105 = -(uint)(0.0 <= fVar65) & auVar87._0_4_;
        uVar106 = -(uint)(0.0 <= fVar66) & auVar87._4_4_;
        uVar107 = -(uint)(0.0 <= fVar82) & auVar87._8_4_;
        uVar108 = -(uint)(0.0 <= fVar60) & auVar87._12_4_;
        auVar4._4_4_ = uVar106;
        auVar4._0_4_ = uVar105;
        auVar4._8_4_ = uVar107;
        auVar4._12_4_ = uVar108;
        iVar27 = movmskps(iVar27,auVar4);
        if (iVar27 != 0) {
          fVar49 = ABS(fVar75);
          fVar61 = ABS(fVar76);
          fVar83 = ABS(fVar77);
          fVar90 = ABS(fVar78);
          uVar105 = -(uint)(fVar65 <= fVar49 - fVar67) & uVar105;
          uVar106 = -(uint)(fVar66 <= fVar61 - fVar70) & uVar106;
          uVar107 = -(uint)(fVar82 <= fVar83 - fVar71) & uVar107;
          uVar108 = -(uint)(fVar60 <= fVar90 - fVar64) & uVar108;
          auVar5._4_4_ = uVar106;
          auVar5._0_4_ = uVar105;
          auVar5._8_4_ = uVar107;
          auVar5._12_4_ = uVar108;
          iVar27 = movmskps(iVar27,auVar5);
          if (iVar27 != 0) {
            fVar60 = (float)(uVar98 ^ (uint)(local_1888 * fVar72 +
                                            local_16e8 * fVar81 + fVar73 * local_16f8));
            fVar64 = (float)(uVar99 ^ (uint)(fStack_1884 * fVar72 +
                                            fStack_16e4 * fVar81 + fVar73 * fStack_16f4));
            fVar65 = (float)(uVar100 ^
                            (uint)(fStack_1880 * fVar72 +
                                  fStack_16e0 * fVar81 + fVar73 * fStack_16f0));
            fVar51 = (float)(uVar101 ^ (uint)(fVar51 * fVar72 + fVar58 * fVar81 + fVar73 * fVar59));
            local_1758 = SUB84(p_Var10,0);
            fStack_1754 = (float)((ulong)p_Var10 >> 0x20);
            fStack_1750 = SUB84(pcVar11,0);
            fStack_174c = (float)((ulong)pcVar11 >> 0x20);
            local_1768 = SUB84(pcVar18,0);
            fStack_1764 = (float)((ulong)pcVar18 >> 0x20);
            fStack_1760 = SUB84(p_Var19,0);
            fStack_175c = (float)((ulong)p_Var19 >> 0x20);
            uVar105 = -(uint)(fVar60 <= fVar49 * local_1768 && fVar49 * local_1758 < fVar60) &
                      uVar105;
            uVar106 = -(uint)(fVar64 <= fVar61 * fStack_1764 && fVar61 * fStack_1754 < fVar64) &
                      uVar106;
            uVar107 = -(uint)(fVar65 <= fVar83 * fStack_1760 && fVar83 * fStack_1750 < fVar65) &
                      uVar107;
            uVar108 = -(uint)(fVar90 * fStack_174c < fVar51 && fVar51 <= fVar90 * fStack_175c) &
                      uVar108;
            auVar3._4_4_ = uVar106;
            auVar3._0_4_ = uVar105;
            auVar3._8_4_ = uVar107;
            auVar3._12_4_ = uVar108;
            iVar27 = movmskps(iVar27,auVar3);
            if (iVar27 != 0) {
              auVar69._0_4_ = -(uint)(fVar75 != 0.0) & uVar105;
              auVar69._4_4_ = -(uint)(fVar76 != 0.0) & uVar106;
              auVar69._8_4_ = -(uint)(fVar77 != 0.0) & uVar107;
              auVar69._12_4_ = -(uint)(fVar78 != 0.0) & uVar108;
              iVar27 = movmskps(iVar27,auVar69);
              uVar22 = auVar69._0_4_;
              uVar23 = auVar69._4_4_;
              uVar88 = auVar69._8_4_;
              uVar89 = auVar69._12_4_;
              if (iVar27 == 0) {
                uVar22 = local_18f8;
                uVar23 = uStack_18f4;
                uVar88 = uStack_18f0;
                uVar89 = uStack_18ec;
              }
            }
          }
        }
      }
      lVar2 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + uVar35 * 8);
      uVar98 = *(uint *)(lVar2 + 0x34);
      auVar46._0_4_ = -(uint)((uVar98 & *(uint *)&(This->intersector8).occluded) == 0);
      auVar46._4_4_ = -(uint)((uVar98 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
      auVar46._8_4_ = -(uint)((uVar98 & *(uint *)&(This->intersector8).name) == 0);
      auVar46._12_4_ = -(uint)((uVar98 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
      auVar47._4_4_ = uVar23;
      auVar47._0_4_ = uVar22;
      auVar47._8_4_ = uVar88;
      auVar47._12_4_ = uVar89;
      auVar47 = ~auVar46 & auVar47;
      iVar33 = movmskps((int)lVar2,auVar47);
      if (iVar33 != 0) {
        auVar80._4_4_ = ~auVar47._4_4_ & auVar80._4_4_;
        auVar80._0_4_ = ~auVar47._0_4_ & uVar93;
        auVar80._8_4_ = ~auVar47._8_4_ & uVar96;
        auVar80._12_4_ = ~auVar47._12_4_ & uVar97;
      }
      iVar27 = 0x7f800000;
      iVar102 = 0x7f800000;
      iVar103 = 0x7f800000;
      iVar104 = 0x7f800000;
      uVar22 = movmskps(iVar33,auVar80);
      this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
              *)(ulong)uVar22;
      if ((uVar22 == 0) ||
         (pBVar31 = pBVar30 + 1,
         bVar39 = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
                   *)0x2 < pBVar30, pBVar30 = pBVar31, this = pBVar31, bVar39)) break;
    }
    auVar55._0_4_ = auVar54._0_4_ & auVar80._0_4_;
    auVar55._4_4_ = auVar54._4_4_ & auVar80._4_4_;
    auVar55._8_4_ = auVar54._8_4_ & auVar80._8_4_;
    auVar55._12_4_ = auVar54._12_4_ & auVar80._12_4_;
    iVar33 = movmskps((int)pBVar31,auVar55);
    if (iVar33 == 0) break;
  }
  uVar26 = CONCAT44(auVar55._4_4_,auVar55._0_4_);
  aVar56._0_8_ = uVar26 ^ 0xffffffffffffffff;
  aVar56._8_4_ = auVar55._8_4_ ^ 0xffffffff;
  aVar56._12_4_ = auVar55._12_4_ ^ 0xffffffff;
LAB_002316cf:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])terminated.field_0 | (undefined1  [16])aVar56);
  uVar22 = movmskps((int)uVar25,(undefined1  [16])terminated.field_0);
  if (uVar22 == 0xf) goto LAB_002317e4;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                (undefined1  [16])terminated.field_0);
  goto LAB_002310b4;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }